

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O1

int main(int argc,char **argv)

{
  ulong uVar1;
  ulong uVar2;
  uint64_t s;
  ulong local_10;
  
  printf("Enter an amount of seconds: ");
  __isoc99_scanf("%lu",&local_10);
  uVar2 = local_10 / 0x3c;
  uVar1 = local_10 / 0xe10;
  local_10 = local_10 % 0x3c;
  printf("This is equal to %lu hours, %lu minutes and %lu seconds\n",uVar1,uVar2 % 0x3c);
  return 0;
}

Assistant:

int main(int argc, char* argv[]) {
  uint64_t s;
  printf("Enter an amount of seconds: ");
  scanf("%" SCNu64, &s);
  // If s was an `int`, you could've written:
  // scanf("%d", &s);

  uint64_t m = s / 60;
  s %= 60;

  uint64_t h = m / 60;
  m %= 60;

  printf("This is equal to %" PRIu64 " hours, %" PRIu64 " minutes and %" PRIu64 " seconds\n", h, m, s);
  // If s, m and h were `int`s, you could've written:
  // printf("This is equal to %d hours, %d minutes and %d seconds\n", h, m, s);

  return 0;
}